

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::TestTexture2DArray::TestTexture2DArray
          (TestTexture2DArray *this,CompressedTexFormat *format,int width,int height,int arraySize)

{
  int levelNdx;
  uint uVar1;
  int layerNdx;
  uint uVar2;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> layers;
  PixelBufferAccess local_58;
  
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTexture2DArray_00bfb4e8;
  local_58.super_ConstPixelBufferAccess.m_format = tcu::getUncompressedFormat(*format);
  tcu::Texture2DArray::Texture2DArray
            (&this->m_texture,(TextureFormat *)&local_58,width,height,arraySize);
  allocateLevels<tcu::Texture2DArray>(&this->m_texture);
  layers.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  layers.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  layers.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar1 = 0;
      (int)uVar1 <
      (int)(((long)(this->m_texture).super_TextureLevelPyramid.m_access.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_texture).super_TextureLevelPyramid.m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28); uVar1 = uVar1 + 1) {
    for (uVar2 = 0; (int)uVar2 < (this->m_texture).m_numLayers; uVar2 = uVar2 + 1) {
      (*(this->super_TestTexture)._vptr_TestTexture[7])(&local_58,this,(ulong)uVar1,(ulong)uVar2);
      std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
      emplace_back<tcu::PixelBufferAccess>(&layers,&local_58);
    }
  }
  TestTexture::populateCompressedLevels(&this->super_TestTexture,*format,&layers);
  std::_Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::~_Vector_base
            (&layers.
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>);
  return;
}

Assistant:

TestTexture2DArray::TestTexture2DArray (const tcu::CompressedTexFormat& format, int width, int height, int arraySize)
	: TestTexture	(format, width, height, arraySize)
	, m_texture		(tcu::getUncompressedFormat(format), width, height, arraySize)
{
	allocateLevels(m_texture);

	std::vector<tcu::PixelBufferAccess> layers;
	for (int levelNdx = 0; levelNdx < m_texture.getNumLevels(); levelNdx++)
		for (int layerNdx = 0; layerNdx < m_texture.getNumLayers(); layerNdx++)
			layers.push_back(getLevel(levelNdx, layerNdx));

	TestTexture::populateCompressedLevels(format, layers);
}